

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

const_reference __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::operator[](basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
             *this,size_type idx)

{
  domain_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string_t local_40;
  
  if (((this->m_type).data & 0xf) != 2) {
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    type_name(&local_40,this);
    std::operator+(&local_60,"cannot use operator[] with ",&local_40);
    std::domain_error::domain_error(this_00,(string *)&local_60);
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  if ((this->m_value).array != (array_t *)0x0) {
    return (((this->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
           )._M_impl.super__Vector_impl_data._M_start + idx;
  }
  __assert_fail("m_value.array != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/alican[P]GeneticAlgorithm/algorithm/../lib/json.hpp"
                ,0xd0b,
                "const_reference nlohmann::basic_json<>::operator[](size_type) const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator]"
               );
}

Assistant:

const_reference operator[](size_type idx) const
        {
            // const operator[] only works for arrays
            if (is_array())
            {
                assert(m_value.array != nullptr);
                return m_value.array->operator[](idx);
            }
            else
            {
                throw std::domain_error("cannot use operator[] with " + type_name());
            }
        }